

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O1

void __thiscall hmi::renderer::draw(renderer *this,vertex *vertices,size_t count,int primitive)

{
  GLint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  mat3f transform;
  mat3f local_58;
  
  SDL_GL_GetDrawableSize(this->m_window,&local_58,(undefined1 *)((long)&local_58.field_0 + 4));
  (*glad_glViewport)(0,0,(GLsizei)local_58.field_0._0_8_,
                     (GLsizei)((ulong)local_58.field_0._0_8_ >> 0x20));
  get_view_matrix(&local_58,this);
  GVar1 = (*glad_glGetUniformLocation)(this->m_program,"u_transform");
  if (GVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Uniform not found",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  else {
    (*glad_glUniformMatrix3fv)(GVar1,1,'\0',(GLfloat *)&local_58);
    (*glad_glUseProgram)(this->m_program);
    GVar2 = (*glad_glGetAttribLocation)(this->m_program,"a_position");
    GVar3 = (*glad_glGetAttribLocation)(this->m_program,"a_color");
    (*glad_glEnableVertexAttribArray)(GVar2);
    (*glad_glEnableVertexAttribArray)(GVar3);
    (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',0x18,vertices);
    (*glad_glVertexAttribPointer)(GVar3,4,0x1406,'\0',0x18,&vertices->color);
    (*glad_glDrawArrays)(primitive,0,(GLsizei)count);
    (*glad_glDisableVertexAttribArray)(GVar2);
    (*glad_glDisableVertexAttribArray)(GVar3);
  }
  return;
}

Assistant:

void renderer::draw(const vertex *vertices, std::size_t count, int primitive) {
    // set viewport

    vec2i size = get_size();
    glViewport(0, 0, size.width, size.height);

    // set transformation matrix

    mat3f transform = get_view_matrix();

    GLint loc = glGetUniformLocation(m_program, "u_transform");

    if (loc == -1) {
      std::cerr << "Uniform not found" << std::endl;
      return;
    }

    glUniformMatrix3fv(loc, 1, GL_FALSE, &transform.data[0][0]);

    // send data

    glUseProgram(m_program);

    GLint position_loc = glGetAttribLocation(m_program, "a_position");

    if (loc == -1) {
      std::cerr << "Attribute not found: a_position" << std::endl;
      return;
    }

    GLint color_loc = glGetAttribLocation(m_program, "a_color");

    if (loc == -1) {
      std::cerr << "Attribute not found: a_color" << std::endl;
      return;
    }

    glEnableVertexAttribArray(position_loc);
    glEnableVertexAttribArray(color_loc);

    const void *position_pointer = &vertices[0].position;
    const void *color_pointer = &vertices[0].color;

    glVertexAttribPointer(position_loc, 2, GL_FLOAT, GL_FALSE, sizeof(vertex), position_pointer);
    glVertexAttribPointer(color_loc, 4, GL_FLOAT, GL_FALSE, sizeof(vertex), color_pointer);

    glDrawArrays(primitive, 0, count);

    glDisableVertexAttribArray(position_loc);
    glDisableVertexAttribArray(color_loc);
  }